

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

void __thiscall tetgenmesh::delaunizesegments(tetgenmesh *this)

{
  int iVar1;
  verttype vVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  point pdVar6;
  point pdVar7;
  shellface sptr;
  point pt;
  point pt_00;
  point p4;
  point p3;
  point p2;
  point p1;
  face parentseg;
  point nearpt;
  undefined1 local_e0 [4];
  int t1ver;
  insertvertexflags ivf;
  point pdStack_68;
  interresult dir;
  point newpt;
  point refpt;
  face *psseg;
  face sseg;
  face searchsh;
  triface spintet;
  triface searchtet;
  tetgenmesh *this_local;
  
  triface::triface((triface *)&spintet.ver);
  triface::triface((triface *)&searchsh.shver);
  face::face((face *)&sseg.shver);
  face::face((face *)&psseg);
  insertvertexflags::insertvertexflags((insertvertexflags *)local_e0);
  t1ver = 1;
  ivf.cdtflag = 4;
  ivf.assignmeshsize = 1;
  ivf.chkencflag = this->b->metric;
  ivf.refinesh.shver = this->useinsertradius;
  while (0 < this->subsegstack->objects) {
    this->subsegstack->objects = this->subsegstack->objects + -1;
    refpt = (point)(this->subsegstack->toparray
                    [this->subsegstack->objects >>
                     ((byte)this->subsegstack->log2objectsperblock & 0x3f)] +
                   (this->subsegstack->objects & (long)this->subsegstack->objectsperblockmark) *
                   (long)this->subsegstack->objectbytes);
    face::operator=((face *)&psseg,(face *)refpt);
    sstpivot1(this,(face *)&psseg,(triface *)&spintet.ver);
    if (spintet._8_8_ == 0) {
      pdVar6 = sorg(this,(face *)&psseg);
      pdVar7 = sdest(this,(face *)&psseg);
      ivf.parentpt._4_4_ =
           scoutsegment(this,pdVar6,pdVar7,(face *)&psseg,(triface *)&spintet.ver,&newpt,
                        (arraypool *)0x0);
      if (ivf.parentpt._4_4_ == SHAREEDGE) {
        sstbond1(this,(face *)&psseg,(triface *)&spintet.ver);
        triface::operator=((triface *)&searchsh.shver,(triface *)&spintet.ver);
        do {
          tssbond1(this,(triface *)&searchsh.shver,(face *)&psseg);
          iVar1 = (int)spintet.tet;
          decode(this,*(tetrahedron *)(searchsh._8_8_ + (long)facepivot1[(int)spintet.tet] * 8),
                 (triface *)&searchsh.shver);
          spintet.tet._0_4_ = facepivot2[iVar1][(int)spintet.tet];
        } while (searchsh._8_8_ != spintet._8_8_);
      }
      else if ((ivf.parentpt._4_4_ == ACROSSFACE) || (ivf.parentpt._4_4_ == ACROSSEDGE)) {
        makepoint(this,&stack0xffffffffffffff98,FREESEGVERTEX);
        getsteinerptonsegment(this,(face *)&psseg,newpt,pdStack_68);
        local_e0 = (undefined1  [4])0x1;
        iVar1 = insertpoint(this,pdStack_68,(triface *)&spintet.ver,(face *)&sseg.shver,
                            (face *)&psseg,(insertvertexflags *)local_e0);
        if (iVar1 == 0) {
          if (local_e0 == (undefined1  [4])0x9) {
            parentseg._8_8_ = org(this,(triface *)&spintet.ver);
            vVar2 = pointtype(this,(point)parentseg._8_8_);
            if (vVar2 == FREESEGVERTEX) {
              face::face((face *)&p1);
              sptr = point2sh(this,(point)parentseg._8_8_);
              sdecode(this,sptr,(face *)&p1);
              pdVar6 = farsorg(this,(face *)&psseg);
              pdVar7 = farsdest(this,(face *)&psseg);
              pt = farsorg(this,(face *)&p1);
              pt_00 = farsdest(this,(face *)&p1);
              printf("Two segments are very close to each other.\n");
              uVar3 = pointmark(this,pdVar6);
              uVar4 = pointmark(this,pdVar7);
              uVar5 = shellmark(this,(face *)&psseg);
              printf("  Segment 1: [%d, %d] #%d\n",(ulong)uVar3,(ulong)uVar4,(ulong)uVar5);
              uVar3 = pointmark(this,pt);
              uVar4 = pointmark(this,pt_00);
              uVar5 = shellmark(this,(face *)&p1);
              printf("  Segment 2: [%d, %d] #%d\n",(ulong)uVar3,(ulong)uVar4,(ulong)uVar5);
              terminatetetgen(this,4);
            }
            else {
              terminatetetgen(this,2);
            }
          }
          else if (local_e0 == (undefined1  [4])0x5) {
            eprevself(this,(triface *)&spintet.ver);
            pdVar6 = sorg(this,(face *)&psseg);
            pdVar7 = sdest(this,(face *)&psseg);
            report_selfint_edge(this,pdVar6,pdVar7,(face *)&psseg,(triface *)&spintet.ver,ACROSSVERT
                               );
          }
          else {
            terminatetetgen(this,2);
          }
        }
        else {
          this->st_segref_count = this->st_segref_count + 1;
          if (0 < this->steinerleft) {
            this->steinerleft = this->steinerleft + -1;
          }
          if (this->useinsertradius != 0) {
            save_segmentpoint_insradius(this,pdStack_68,(point)ivf.smlen,(double)ivf._88_8_);
          }
        }
      }
      else {
        terminatetetgen(this,2);
      }
    }
  }
  return;
}

Assistant:

void tetgenmesh::delaunizesegments()
{
  triface searchtet, spintet;
  face searchsh;
  face sseg, *psseg;
  point refpt, newpt;
  enum interresult dir;
  insertvertexflags ivf;
  int t1ver; 


  ivf.bowywat = 1; // Use Bowyer-Watson insertion.
  ivf.sloc = (int) ONEDGE; // on 'sseg'.
  ivf.sbowywat = 1; // Use Bowyer-Watson insertion.
  ivf.assignmeshsize = b->metric;
  ivf.smlenflag = useinsertradius; // Return the closet mesh vertex.

  // Loop until 'subsegstack' is empty.
  while (subsegstack->objects > 0l) {
    // seglist is used as a stack.
    subsegstack->objects--;
    psseg = (face *) fastlookup(subsegstack, subsegstack->objects);
    sseg = *psseg;

    // Check if this segment has been recovered.
    sstpivot1(sseg, searchtet);
    if (searchtet.tet != NULL) {
      continue; // Not a missing segment.
    }

    // Search the segment.
    dir = scoutsegment(sorg(sseg), sdest(sseg), &sseg,&searchtet,&refpt,NULL);

    if (dir == SHAREEDGE) {
      // Found this segment, insert it.
      // Let the segment remember an adjacent tet.
      sstbond1(sseg, searchtet);
      // Bond the segment to all tets containing it.
      spintet = searchtet;
      do {
        tssbond1(spintet, sseg);
        fnextself(spintet);
      } while (spintet.tet != searchtet.tet);
    } else {
      if ((dir == ACROSSFACE) || (dir == ACROSSEDGE)) {
        // The segment is missing. Split it.
        // Create a new point.
        makepoint(&newpt, FREESEGVERTEX);
        //setpointtype(newpt, FREESEGVERTEX);
        getsteinerptonsegment(&sseg, refpt, newpt);

        // Start searching from 'searchtet'.
        ivf.iloc = (int) OUTSIDE;
        // Insert the new point into the tetrahedralization T.
        //   Missing segments and subfaces are queued for recovery.
        //   Note that T is convex (nonconvex = 0).
        if (insertpoint(newpt, &searchtet, &searchsh, &sseg, &ivf)) {
          // The new point has been inserted.
          st_segref_count++;
          if (steinerleft > 0) steinerleft--;
          if (useinsertradius) {
            save_segmentpoint_insradius(newpt, ivf.parentpt, ivf.smlen);
          } 
        } else {
          if (ivf.iloc == (int) NEARVERTEX) {
            // The new point (in the segment) is very close to an existing 
            //   vertex -- a small feature is detected.
            point nearpt = org(searchtet);
            if (pointtype(nearpt) == FREESEGVERTEX) {
              face parentseg;
              sdecode(point2sh(nearpt), parentseg);
              point p1 = farsorg(sseg);
              point p2 = farsdest(sseg);
              point p3 = farsorg(parentseg);
              point p4 = farsdest(parentseg);
              printf("Two segments are very close to each other.\n");
              printf("  Segment 1: [%d, %d] #%d\n", pointmark(p1),
                     pointmark(p2), shellmark(sseg));
              printf("  Segment 2: [%d, %d] #%d\n", pointmark(p3),
                     pointmark(p4), shellmark(parentseg));
              terminatetetgen(this, 4);
            } else {
              terminatetetgen(this, 2);
            }
          } else if (ivf.iloc == (int) ONVERTEX) {
            // The new point (in the segment) is coincident with an existing 
            //   vertex -- a self-intersection is detected.
            eprevself(searchtet);
            report_selfint_edge(sorg(sseg), sdest(sseg), &sseg, &searchtet,
                                ACROSSVERT);
          } else {
            // An unknown case. Report a bug.
            terminatetetgen(this, 2);
          }
        }
      } else {
        // An unknown case. Report a bug.
        terminatetetgen(this, 2);
      }
    }
  } // while
}